

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

bool __thiscall MeCab::anon_unknown_0::LatticeImpl::next(LatticeImpl *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  NBestGenerator *this_00;
  
  iVar3 = (*(this->super_Lattice)._vptr_Lattice[0x12])(this,2);
  pp_Var1 = (this->super_Lattice)._vptr_Lattice;
  if ((char)iVar3 == '\0') {
    (*pp_Var1[0x25])(this,"MECAB_NBEST request type is not set");
  }
  else {
    iVar3 = (*pp_Var1[0x16])(this);
    this_00 = *(NBestGenerator **)(CONCAT44(extraout_var,iVar3) + 0x48);
    if (this_00 == (NBestGenerator *)0x0) {
      this_00 = (NBestGenerator *)operator_new(0x60);
      this_00->_vptr_NBestGenerator = (_func_int **)&PTR__NBestGenerator_00172ae8;
      (this_00->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->agenda_).c.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->freelist_)._vptr_FreeList = (_func_int **)&PTR__FreeList_00172b18;
      (this_00->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->freelist_).freeList.
      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->freelist_).pi_ = 0;
      (this_00->freelist_).li_ = 0;
      (this_00->freelist_).size = 0x200;
      *(NBestGenerator **)(CONCAT44(extraout_var,iVar3) + 0x48) = this_00;
    }
    bVar2 = NBestGenerator::next(this_00);
    if (bVar2) {
      Viterbi::buildResultForNBest(&this->super_Lattice);
      return true;
    }
  }
  return false;
}

Assistant:

bool LatticeImpl::next() {
  if (!has_request_type(MECAB_NBEST)) {
    set_what("MECAB_NBEST request type is not set");
    return false;
  }

  if (!allocator()->nbest_generator()->next()) {
    return false;
  }

  Viterbi::buildResultForNBest(this);
  return true;
}